

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

void __thiscall
jrtplib::RTPSession::BYEDestroy
          (RTPSession *this,RTPTime *maxwaittime,void *reason,size_t reasonlength)

{
  size_t *psVar1;
  RTPMemoryManager *pRVar2;
  RTPTransmitter *pRVar3;
  _List_node_base *p_Var4;
  double dVar5;
  bool bVar6;
  RTCPCompoundPacket *pRVar7;
  RTPSession *pRVar8;
  bool bVar9;
  int iVar10;
  _List_node_base *p_Var11;
  int *piVar12;
  size_t sVar13;
  RTCPScheduler *this_00;
  _List_node_base *p_Var14;
  RTCPCompoundPacket *pack;
  timespec tpMono;
  timespec tpMono_1;
  RTCPCompoundPacket *local_80;
  timespec local_78;
  RTPSession *local_60;
  timespec local_58;
  RTCPScheduler *local_48;
  _List_node_base *local_40;
  double local_38;
  
  if (this->created == true) {
    local_60 = this;
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,&local_78);
      clock_gettime(1,&local_58);
      local_38 = (double)local_78.tv_nsec * 1e-09 + (double)local_78.tv_sec;
      RTPTime::CurrentTime()::s_startOffet =
           local_38 - ((double)local_58.tv_nsec * 1e-09 + (double)local_58.tv_sec);
    }
    else {
      clock_gettime(1,&local_78);
      local_38 = (double)local_78.tv_nsec * 1e-09 + (double)local_78.tv_sec +
                 RTPTime::CurrentTime()::s_startOffet;
    }
    pRVar8 = local_60;
    local_38 = local_38 + maxwaittime->m_t;
    if (local_60->sentpackets == true) {
      sVar13 = 0xff;
      if (reasonlength < 0xff) {
        sVar13 = reasonlength;
      }
      iVar10 = RTCPPacketBuilder::BuildBYEPacket
                         (&local_60->rtcpbuilder,&local_80,reason,sVar13,
                          local_60->useSR_BYEifpossible);
      if (-1 < iVar10) {
        p_Var11 = (_List_node_base *)operator_new(0x18);
        p_Var11[1]._M_next = (_List_node_base *)local_80;
        std::__detail::_List_node_base::_M_hook(p_Var11);
        sVar13 = (pRVar8->byepackets).
                 super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                 ._M_impl._M_node._M_size;
        (pRVar8->byepackets).
        super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
        ._M_impl._M_node._M_size = sVar13 + 1;
        if (sVar13 == 0) {
          RTCPScheduler::ScheduleBYEPacket(&pRVar8->rtcpsched,local_80->compoundpacketlength);
        }
      }
    }
    p_Var11 = (_List_node_base *)&pRVar8->byepackets;
    if ((pRVar8->byepackets).
        super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
        ._M_impl._M_node.super__List_node_base._M_next != p_Var11) {
      this_00 = &local_60->rtcpsched;
      bVar6 = false;
      local_48 = this_00;
      local_40 = p_Var11;
      do {
        if (RTPTime::CurrentTime()::s_initialized == '\0') {
          RTPTime::CurrentTime()::s_initialized = '\x01';
          clock_gettime(0,&local_78);
          clock_gettime(1,&local_58);
          dVar5 = (double)local_78.tv_nsec * 1e-09 + (double)local_78.tv_sec;
          RTPTime::CurrentTime()::s_startOffet =
               dVar5 - ((double)local_58.tv_nsec * 1e-09 + (double)local_58.tv_sec);
        }
        else {
          clock_gettime(1,&local_78);
          dVar5 = (double)local_78.tv_nsec * 1e-09 + (double)local_78.tv_sec +
                  RTPTime::CurrentTime()::s_startOffet;
        }
        if (local_38 <= dVar5) {
          bVar6 = true;
        }
        bVar9 = RTCPScheduler::IsTime(this_00);
        pRVar8 = local_60;
        if (bVar9) {
          p_Var11 = (local_60->byepackets).
                    super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          local_80 = (RTCPCompoundPacket *)p_Var11[1]._M_next;
          psVar1 = &(local_60->byepackets).
                    super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var11,0x18);
          SendRTCPData(pRVar8,local_80->compoundpacket,local_80->compoundpacketlength);
          (*(pRVar8->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(pRVar8,local_80);
          pRVar7 = local_80;
          pRVar2 = (pRVar8->super_RTPMemoryObject).mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            if (local_80 != (RTCPCompoundPacket *)0x0) {
              (*(code *)((_List_node_base *)(local_80->super_RTPMemoryObject)._vptr_RTPMemoryObject)
                        ->_M_prev)();
            }
          }
          else {
            (*(code *)((_List_node_base *)(local_80->super_RTPMemoryObject)._vptr_RTPMemoryObject)->
                      _M_next)(local_80);
            (*pRVar2->_vptr_RTPMemoryManager[3])(pRVar2,pRVar7);
          }
          p_Var11 = local_40;
          this_00 = local_48;
          p_Var14 = (((_List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                       *)&local_40->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var14 == local_40) {
            bVar6 = true;
          }
          else {
            RTCPScheduler::ScheduleBYEPacket(local_48,(size_t)p_Var14[1]._M_next[2]._M_next);
          }
        }
        if (!bVar6) {
          local_78.tv_sec = 0;
          local_78.tv_nsec = 99999999;
          do {
            iVar10 = nanosleep(&local_78,&local_58);
            local_78.tv_sec = local_58.tv_sec;
            local_78.tv_nsec = local_58.tv_nsec;
            if (iVar10 != -1) break;
            piVar12 = __errno_location();
          } while (*piVar12 == 4);
        }
      } while (!bVar6);
    }
    pRVar8 = local_60;
    if (local_60->deletetransmitter == true) {
      pRVar2 = (local_60->super_RTPMemoryObject).mgr;
      pRVar3 = local_60->rtptrans;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        if (pRVar3 != (RTPTransmitter *)0x0) {
          (*(pRVar3->super_RTPMemoryObject)._vptr_RTPMemoryObject[1])(pRVar3);
        }
      }
      else {
        (**(pRVar3->super_RTPMemoryObject)._vptr_RTPMemoryObject)(pRVar3);
        (*pRVar2->_vptr_RTPMemoryManager[3])(pRVar2,pRVar3);
      }
    }
    RTPPacketBuilder::Destroy(&pRVar8->packetbuilder);
    RTCPPacketBuilder::Destroy(&pRVar8->rtcpbuilder);
    RTCPScheduler::Reset(&pRVar8->rtcpsched);
    RTPCollisionList::Clear(&pRVar8->collisionlist);
    RTPSources::Clear(&(pRVar8->sources).super_RTPSources);
    for (p_Var14 = (pRVar8->byepackets).
                   super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                   ._M_impl._M_node.super__List_node_base._M_next; p_Var14 != p_Var11;
        p_Var14 = (((_List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                     *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      p_Var4 = p_Var14[1]._M_next;
      pRVar2 = (pRVar8->super_RTPMemoryObject).mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        if (p_Var4 != (_List_node_base *)0x0) {
          (**(code **)((long)p_Var4->_M_next + 8))(p_Var4);
        }
      }
      else {
        (**(code **)p_Var4->_M_next)(p_Var4);
        (*pRVar2->_vptr_RTPMemoryManager[3])(pRVar2,p_Var4);
      }
    }
    std::__cxx11::
    list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>::clear
              ((list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                *)p_Var11);
    pRVar8->created = false;
  }
  return;
}

Assistant:

void RTPSession::BYEDestroy(const RTPTime &maxwaittime,const void *reason,size_t reasonlength)
{
	if (!created)
		return;

	// first, stop the thread so we have full control over all components
	
#ifdef RTP_SUPPORT_THREAD
	if (pollthread)
		RTPDelete(pollthread,GetMemoryManager());
#endif // RTP_SUPPORT_THREAD

	RTPTime stoptime = RTPTime::CurrentTime();
	stoptime += maxwaittime;

	// add bye packet to the list if we've sent data

	RTCPCompoundPacket *pack;

	if (sentpackets)
	{
		int status;
		
		reasonlength = (reasonlength>RTCP_BYE_MAXREASONLENGTH)?RTCP_BYE_MAXREASONLENGTH:reasonlength;
	       	status = rtcpbuilder.BuildBYEPacket(&pack,reason,reasonlength,useSR_BYEifpossible);
		if (status >= 0)
		{
			byepackets.push_back(pack);
	
			if (byepackets.size() == 1)
				rtcpsched.ScheduleBYEPacket(pack->GetCompoundPacketLength());
		}
	}
	
	if (!byepackets.empty())
	{
		bool done = false;
		
		while (!done)
		{
			RTPTime curtime = RTPTime::CurrentTime();
			
			if (curtime >= stoptime)
				done = true;
		
			if (rtcpsched.IsTime())
			{
				pack = *(byepackets.begin());
				byepackets.pop_front();
			
				SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength());
				
				OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
				
				RTPDelete(pack,GetMemoryManager());
				if (!byepackets.empty()) // more bye packets to send, schedule them
					rtcpsched.ScheduleBYEPacket((*(byepackets.begin()))->GetCompoundPacketLength());
				else
					done = true;
			}
			if (!done)
				RTPTime::Wait(RTPTime(0,100000));
		}
	}
	
	if (deletetransmitter)
		RTPDelete(rtptrans,GetMemoryManager());
	packetbuilder.Destroy();
	rtcpbuilder.Destroy();
	rtcpsched.Reset();
	collisionlist.Clear();
	sources.Clear();

	// clear rest of bye packets
	std::list<RTCPCompoundPacket *>::const_iterator it;

	for (it = byepackets.begin() ; it != byepackets.end() ; it++)
		RTPDelete(*it,GetMemoryManager());
	byepackets.clear();
	
	created = false;
}